

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::Type::Type(Type *this,initializer_list<wasm::Type> types)

{
  initializer_list<wasm::Type> __l;
  allocator<wasm::Type> local_49;
  iterator local_48;
  iterator pTStack_40;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_38;
  Type *local_20;
  Type *this_local;
  initializer_list<wasm::Type> types_local;
  
  pTStack_40 = (iterator)types._M_len;
  local_48 = types._M_array;
  local_20 = this;
  this_local = local_48;
  types_local._M_array = pTStack_40;
  std::allocator<wasm::Type>::allocator(&local_49);
  __l._M_len = (size_type)pTStack_40;
  __l._M_array = local_48;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_38,__l,&local_49);
  Type(this,&local_38);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_38);
  std::allocator<wasm::Type>::~allocator(&local_49);
  return;
}

Assistant:

Type::Type(std::initializer_list<Type> types) : Type(Tuple(types)) {}